

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O1

size_t flatbuffers::InlineAlignment(Type *type)

{
  BaseType BVar1;
  size_t sVar2;
  StructDef *pSVar3;
  
  sVar2 = 1;
  switch(type->base_type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_BOOL:
  case BASE_TYPE_CHAR:
  case BASE_TYPE_UCHAR:
    break;
  case BASE_TYPE_SHORT:
  case BASE_TYPE_USHORT:
switchD_0013b85b_caseD_5:
    sVar2 = 2;
    break;
  case BASE_TYPE_INT:
  case BASE_TYPE_UINT:
  case BASE_TYPE_FLOAT:
  case BASE_TYPE_STRING:
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_UNION:
switchD_0013b85b_caseD_7:
    sVar2 = 4;
    break;
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
  case BASE_TYPE_DOUBLE:
  case BASE_TYPE_VECTOR64:
    goto switchD_0013b85b_caseD_0;
  case BASE_TYPE_STRUCT:
    if (type->struct_def->fixed == true) {
      pSVar3 = type->struct_def;
      goto LAB_0013b875;
    }
    switch(type->base_type) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_CHAR:
    case BASE_TYPE_UCHAR:
      break;
    case BASE_TYPE_SHORT:
    case BASE_TYPE_USHORT:
      goto switchD_0013b85b_caseD_5;
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      goto switchD_0013b85b_caseD_7;
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
    case BASE_TYPE_DOUBLE:
    case BASE_TYPE_VECTOR64:
      goto switchD_0013b85b_caseD_0;
    case BASE_TYPE_ARRAY:
      goto switchD_0013b85b_caseD_11;
    default:
      goto switchD_0013b85b_default;
    }
  case BASE_TYPE_ARRAY:
switchD_0013b85b_caseD_11:
    BVar1 = type->element;
    switch((ulong)BVar1) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
      break;
    case 5:
    case 6:
      goto switchD_0013b85b_caseD_5;
    case 7:
    case 8:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0x10:
    case 0x11:
      goto switchD_0013b85b_caseD_7;
    case 9:
    case 10:
    case 0xc:
    case 0x12:
switchD_0013b85b_caseD_0:
      return 8;
    case 0xf:
      pSVar3 = type->struct_def;
      if (pSVar3->fixed == true) {
LAB_0013b875:
        return pSVar3->minalign;
      }
      if (BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) {
        return *(size_t *)(&DAT_00360290 + (ulong)BVar1 * 8);
      }
    default:
switchD_0013b85b_default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                    ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
    }
  default:
    goto switchD_0013b85b_default;
  }
  return sVar2;
}

Assistant:

inline size_t InlineAlignment(const Type &type) {
  if (IsStruct(type)) {
    return type.struct_def->minalign;
  } else if (IsArray(type)) {
    return IsStruct(type.VectorType()) ? type.struct_def->minalign
                                       : SizeOf(type.element);
  } else {
    return SizeOf(type.base_type);
  }
}